

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  _xmlNode *old;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root,doc);
    root->parent = (_xmlNode *)doc;
    for (old = doc->children; old != (xmlNodePtr)0x0; old = old->next) {
      if (old->type == XML_ELEMENT_NODE) {
        xmlReplaceNode(old,root);
        return old;
      }
    }
    if (doc->children == (xmlNodePtr)0x0) {
      doc->children = root;
      doc->last = root;
    }
    else {
      xmlAddSibling(doc->children,root);
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root, doc);
    root->parent = (xmlNodePtr) doc;
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}